

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall QXmlStreamReaderPrivate::scanPublicOrSystem(QXmlStreamReaderPrivate *this)

{
  uint uVar1;
  QXmlStreamReaderPrivate *in_RDI;
  undefined1 unaff_retaddr;
  short unaff_retaddr_00;
  char *in_stack_00000008;
  QXmlStreamReaderPrivate *in_stack_00000010;
  undefined1 local_1;
  
  uVar1 = peekChar(in_RDI);
  if (uVar1 == 0x50) {
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  }
  else if (uVar1 == 0x53) {
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QXmlStreamReaderPrivate::scanPublicOrSystem()
{
    switch (peekChar()) {
    case 'S':
        return scanString(spell[SYSTEM], SYSTEM);
    case 'P':
        return scanString(spell[PUBLIC], PUBLIC);
    default:
        ;
    }
    return false;
}